

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  unsigned_short *puVar1;
  undefined1 auVar2 [16];
  int line_start_idx;
  uint uVar3;
  int iVar4;
  ImWchar *text;
  undefined1 in_R8B;
  int iVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [64];
  float fVar10;
  ImWchar *local_38;
  undefined1 extraout_var [56];
  
  iVar4 = str->CurLenW;
  if (iVar4 < 1) {
    return iVar4;
  }
  fVar10 = 0.0;
  uVar7 = 0;
  while( true ) {
    puVar1 = (str->TextW).Data;
    local_38 = (ImWchar *)0x0;
    line_start_idx = (int)uVar7;
    auVar9._0_8_ = InputTextCalcTextSizeW
                             (puVar1 + line_start_idx,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,
                              (bool)in_R8B);
    auVar9._8_56_ = extraout_var;
    iVar6 = (int)((ulong)((long)local_38 - (long)(puVar1 + line_start_idx)) >> 1);
    if (iVar6 < 1) {
      return iVar4;
    }
    if ((y < fVar10) && (line_start_idx == 0)) {
      return 0;
    }
    auVar2 = vmovshdup_avx(auVar9._0_16_);
    fVar10 = fVar10 + auVar2._0_4_;
    if (y < fVar10) break;
    uVar7 = (ulong)(uint)(line_start_idx + iVar6);
    if (iVar4 <= line_start_idx + iVar6) {
      return iVar4;
    }
  }
  if (0.0 <= x) {
    if (x < auVar9._0_4_) {
      uVar7 = (long)local_38 + (uVar7 * -2 - (long)puVar1);
      iVar5 = 0;
      iVar4 = 0;
      fVar10 = 0.0;
      do {
        fVar8 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,iVar4);
        if (x < fVar10 + fVar8) {
          if (fVar10 + fVar8 * 0.5 <= x) {
            uVar7 = (ulong)((line_start_idx - iVar5) + 1);
          }
          else {
            uVar7 = (ulong)(uint)(line_start_idx - iVar5);
          }
          goto LAB_0017d616;
        }
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + -1;
        fVar10 = fVar10 + fVar8;
      } while (-(int)(uVar7 >> 1) != iVar5);
    }
    uVar3 = line_start_idx + iVar6;
    if ((str->TextW).Size < (int)uVar3) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66b,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    uVar7 = (ulong)uVar3;
    if ((str->TextW).Data[uVar3 - 1] == 10) {
      uVar7 = (ulong)(uVar3 - 1);
    }
  }
LAB_0017d616:
  return (int)uVar7;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}